

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-base64.c
# Opt level: O3

void test_base64_encode_(TEST_VECTOR *vectors,BASE64_OPTIONS *options)

{
  char *__s;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  char *blob;
  TEST_VECTOR *pTVar6;
  char out_buf [256];
  char local_138 [264];
  
  pcVar4 = vectors->blob;
  if (pcVar4 != (char *)0x0) {
    pTVar6 = vectors + 1;
    do {
      __s = pTVar6[-1].base64;
      sVar3 = strlen(pcVar4);
      uVar1 = base64_encode(pcVar4,(uint)sVar3,(char *)0x0,0,options);
      uVar5 = 0;
      if (-1 < (int)uVar1) {
        sVar3 = strlen(__s);
        uVar5 = (uint)(sVar3 + 1 == (ulong)uVar1);
      }
      iVar2 = acutest_check_(uVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-base64.c"
                             ,0x4a,"expected output size for \'%s\' -> \'%s\'",pcVar4,__s);
      if (iVar2 == 0) {
        sVar3 = strlen(__s);
        acutest_message_("Expected: %d bytes",sVar3 & 0xffffffff);
        acutest_message_("Produced: %d bytes",(ulong)uVar1);
      }
      sVar3 = strlen(pcVar4);
      uVar1 = base64_encode(pcVar4,(uint)sVar3,local_138,0x100,options);
      uVar5 = 0;
      if (-1 < (int)uVar1) {
        sVar3 = strlen(__s);
        if (sVar3 == uVar1) {
          iVar2 = bcmp(local_138,__s,(ulong)uVar1);
          uVar5 = (uint)(iVar2 == 0);
        }
      }
      iVar2 = acutest_check_(uVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-base64.c"
                             ,0x54,"encoding \'%s\' -> %s",pcVar4,__s);
      if (iVar2 == 0) {
        acutest_message_("Expected: \'%s\'",__s);
        pcVar4 = "base64_encode() failed";
        if (0 < (int)uVar1) {
          pcVar4 = local_138;
        }
        acutest_message_("Produced: \'%s\'",pcVar4);
      }
      pcVar4 = pTVar6->blob;
      pTVar6 = pTVar6 + 1;
    } while (pcVar4 != (char *)0x0);
  }
  return;
}

Assistant:

static void
test_base64_encode_(const TEST_VECTOR* vectors, const BASE64_OPTIONS* options)
{
    char out_buf[256];
    int i;

    for(i = 0; vectors[i].blob != NULL; i++) {
        const char* blob = vectors[i].blob;
        const char* base64 = vectors[i].base64;
        int out_size;

        out_size = base64_encode(blob, strlen(blob), NULL, 0, options);
        if(!TEST_CHECK_(out_size >= 0  &&
                        out_size == strlen(base64)+1,
                        "expected output size for '%s' -> '%s'", blob, base64))
        {
            TEST_MSG("Expected: %d bytes", (int) strlen(base64));
            TEST_MSG("Produced: %d bytes", (int) out_size);
        }

        out_size = base64_encode(blob, strlen(blob), out_buf, sizeof(out_buf), options);
        if(!TEST_CHECK_(out_size >= 0  &&
                        out_size == strlen(base64)  &&
                        memcmp(out_buf, base64, out_size) == 0,
                        "encoding '%s' -> %s", blob, base64))
        {
            TEST_MSG("Expected: '%s'", base64);
            TEST_MSG("Produced: '%s'", (out_size > 0 ? out_buf : "base64_encode() failed"));
        }
    }
}